

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexHelper.cpp
# Opt level: O2

Var Js::RegexHelper::RegexExecImpl
              (ScriptContext *scriptContext,JavascriptRegExp *regularExpression,
              JavascriptString *input,bool noResult,void *stackAllocationPointer)

{
  RegexPattern *this;
  RecyclableObject *nonMatchValue;
  SparseArraySegmentBase *pSVar1;
  code *pcVar2;
  void *stackAllocationPointer_00;
  ScriptContext *pSVar3;
  bool bVar4;
  bool isSticky;
  bool bVar5;
  uint16 uVar6;
  charcount_t inputLength;
  char16 *input_00;
  JavascriptArray *pJVar7;
  undefined4 *puVar8;
  Var ptr;
  CharCount inputLength_00;
  undefined7 in_register_00000009;
  JavascriptString *pJVar9;
  ulong uVar10;
  SparseArraySegmentBase *this_00;
  ulong uVar11;
  GroupInfo GVar12;
  uint local_58;
  undefined4 local_54;
  CharCount offset;
  void *local_48;
  JavascriptString *local_40;
  ScriptContext *local_38;
  
  this = (regularExpression->pattern).ptr;
  pJVar9 = input;
  local_48 = stackAllocationPointer;
  local_38 = scriptContext;
  RegexHelperTrace(scriptContext,Exec,regularExpression,input);
  inputLength_00 = (CharCount)pJVar9;
  bVar4 = UnifiedRegex::RegexPattern::IsGlobal(this);
  _offset = this;
  isSticky = UnifiedRegex::RegexPattern::IsSticky(this);
  local_40 = input;
  inputLength = JavascriptString::GetLength(input);
  bVar5 = GetInitialOffset(bVar4,isSticky,regularExpression,inputLength_00,&local_58);
  if (bVar5) {
    local_54 = (undefined4)CONCAT71(in_register_00000009,noResult);
    if (inputLength < local_58) {
      uVar11 = 0xffffffffffffffff;
      uVar10 = 0;
    }
    else {
      input_00 = JavascriptString::GetString(local_40);
      GVar12 = SimpleMatch(local_38,_offset,input_00,inputLength,local_58);
      uVar10 = (ulong)GVar12 & 0xffffffff;
      uVar11 = (ulong)GVar12 >> 0x20;
    }
    GVar12 = (GroupInfo)(uVar11 << 0x20 | uVar10);
    PropagateLastMatch(local_38,bVar4,isSticky,regularExpression,local_40,GVar12,GVar12,true,true,
                       false);
    if (((char)local_54 == '\0') && ((int)uVar11 != -1)) {
      uVar6 = UnifiedRegex::RegexPattern::NumGroups(_offset);
      pSVar3 = local_38;
      stackAllocationPointer_00 = local_48;
      local_48 = (void *)(ulong)uVar6;
      pJVar7 = CreateExecResult(stackAllocationPointer_00,local_38,(uint)uVar6,local_40,GVar12);
      nonMatchValue =
           (((pSVar3->super_ScriptContextBase).javascriptLibrary)->super_JavascriptLibraryBase).
           undefinedValue.ptr;
      this_00 = (pJVar7->head).ptr + 1;
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      uVar11 = 0;
      do {
        if (local_48 == (void *)uVar11) {
          return pJVar7;
        }
        pSVar1 = (pJVar7->head).ptr;
        if (pSVar1->length + pSVar1->left <= uVar11) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          *puVar8 = 1;
          bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/RegexHelper.cpp"
                                      ,0x281,
                                      "(groupId < result->GetHead()->left + result->GetHead()->length)"
                                      ,
                                      "groupId < result->GetHead()->left + result->GetHead()->length"
                                     );
          if (!bVar4) {
            pcVar2 = (code *)invalidInstructionException();
            (*pcVar2)();
          }
          *puVar8 = 0;
        }
        ptr = GetGroup(local_38,_offset,local_40,nonMatchValue,(int)uVar11);
        Memory::WriteBarrierPtr<void>::WriteBarrierSet((WriteBarrierPtr<void> *)this_00,ptr);
        uVar11 = uVar11 + 1;
        this_00 = (SparseArraySegmentBase *)&this_00->size;
      } while( true );
    }
  }
  return (((local_38->super_ScriptContextBase).javascriptLibrary)->super_JavascriptLibraryBase).
         nullValue.ptr;
}

Assistant:

Var RegexHelper::RegexExecImpl(ScriptContext* scriptContext, JavascriptRegExp* regularExpression, JavascriptString* input, bool noResult, void *const stackAllocationPointer)
    {
        UnifiedRegex::RegexPattern* pattern = regularExpression->GetPattern();

#if ENABLE_REGEX_CONFIG_OPTIONS
        RegexHelperTrace(scriptContext, UnifiedRegex::RegexStats::Exec, regularExpression, input);
#endif

        const bool isGlobal = pattern->IsGlobal();
        const bool isSticky = pattern->IsSticky();
        CharCount offset;
        CharCount inputLength = input->GetLength();
        if (!GetInitialOffset(isGlobal, isSticky, regularExpression, inputLength, offset))
        {
            return scriptContext->GetLibrary()->GetNull();
        }

        UnifiedRegex::GroupInfo match; // initially undefined
        if (offset <= inputLength)
        {
            const char16* inputStr = input->GetString();
            match = SimpleMatch(scriptContext, pattern, inputStr, inputLength, offset);
        }

        // else: match remains undefined
        PropagateLastMatch(scriptContext, isGlobal, isSticky, regularExpression, input, match, match, true, true);

        if (noResult || match.IsUndefined())
        {
            return scriptContext->GetLibrary()->GetNull();
        }

        const int numGroups = pattern->NumGroups();
        Assert(numGroups >= 0);
        JavascriptArray* result = CreateExecResult(stackAllocationPointer, scriptContext, numGroups, input, match);
        Var nonMatchValue = NonMatchValue(scriptContext, false);
        Field(Var) *elements = ((SparseArraySegment<Var>*)result->GetHead())->elements;
        for (uint groupId = 0; groupId < (uint)numGroups; groupId++)
        {
            Assert(groupId < result->GetHead()->left + result->GetHead()->length);
            elements[groupId] = GetGroup(scriptContext, pattern, input, nonMatchValue, groupId);
        }
        return result;
    }